

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void charevnt_breakfast_common(tgestate_t *state,character_t character,route_t *route)

{
  uint8_t routeindex;
  route_t *route_local;
  character_t character_local;
  tgestate_t *state_local;
  
  route->step = '\0';
  if (character < 0x14) {
    routeindex = '\x18';
    if ((character & 1) != 0) {
      routeindex = '\x19';
    }
  }
  else {
    routeindex = character + 0xfe;
  }
  route->index = routeindex;
  return;
}

Assistant:

static void charevnt_breakfast_common(tgestate_t *state,
                                      character_t character,
                                      route_t    *route)
{
  uint8_t routeindex; /* was A */

  assert(state != NULL);
  ASSERT_CHARACTER_VALID(character);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  route->step = 0;

  if (character >= character_20_PRISONER_1)
  {
    /* Prisoners 1..6 take routes 18..23 (routes to sitting). */
    routeindex = character - 2;
  }
  else
  {
    /* Guards take route 24 if even, or 25 if odd. */
    routeindex = 24;
    if (character & 1)
      routeindex++;
  }

  route->index = routeindex;
}